

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynYield * ParseYield(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynBase *value;
  undefined4 extraout_var;
  Lexeme *end;
  SynYield *this;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_yield) {
    ctx->currentLexeme = begin + 1;
    value = ParseAssignment(ctx);
    anon_unknown.dwarf_1519a::CheckConsume
              (ctx,lex_semicolon,"ERROR: yield statement must be followed by an expression or \';\'"
              );
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (SynYield *)CONCAT44(extraout_var,iVar1);
    end = ParseContext::Previous(ctx);
    SynYield::SynYield(this,begin,end,value);
  }
  else {
    this = (SynYield *)0x0;
  }
  return this;
}

Assistant:

SynYield* ParseYield(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_yield))
	{
		// Optional
		SynBase *value = ParseAssignment(ctx);

		CheckConsume(ctx, lex_semicolon, "ERROR: yield statement must be followed by an expression or ';'");

		return new (ctx.get<SynYield>()) SynYield(start, ctx.Previous(), value);
	}

	return NULL;
}